

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

void __thiscall Matrix::Matrix(Matrix *this,int dimensions,int *sizes)

{
  int *__dest;
  ulong uVar1;
  
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015d708;
  (this->matrixParent).px = (double *)0x0;
  (this->matrixParent).pn.pi_ = (sp_counted_base *)0x0;
  (this->sMatrixName)._M_dataplus._M_p = (pointer)&(this->sMatrixName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sMatrixName,"data","");
  this->nMatrixDimension = dimensions;
  uVar1 = 0xffffffffffffffff;
  if (-1 < dimensions) {
    uVar1 = (long)dimensions * 4;
  }
  __dest = (int *)operator_new__(uVar1);
  this->pSize = __dest;
  if (0 < (long)this->nMatrixDimension) {
    memcpy(__dest,sizes,(long)this->nMatrixDimension << 2);
  }
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int dimensions, int* sizes) : sMatrixName("data") 
 { 
	nMatrixDimension = dimensions;
	pSize = new int[nMatrixDimension];
	for(int i=0; i<nMatrixDimension; i++)
		pSize[i] = sizes[i];
	bReference = false;
	init();
}